

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

void __thiscall ami_nvar_t::nvar_entry_t::~nvar_entry_t(nvar_entry_t *this)

{
  ~nvar_entry_t(this);
  operator_delete(this);
  return;
}

Assistant:

ami_nvar_t::nvar_entry_t::~nvar_entry_t() {
    _clean_up();
}